

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e00dc::AVxEncoderThreadTest::PreEncodeFrameHook
          (AVxEncoderThreadTest *this,VideoSource *param_2,Encoder *encoder)

{
  undefined8 in_RDX;
  long *in_RDI;
  int in_stack_00000048;
  int in_stack_0000004c;
  Encoder *in_stack_00000050;
  
  if ((*(byte *)((long)in_RDI + 0x3f4) & 1) == 0) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    if (((int)in_RDI[0x7f] == 1) || ((int)in_RDI[0x7f] == 2)) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      if ((4 < *(int *)((long)in_RDI + 0x3fc)) && ((int)in_RDI[0x81] == 0)) {
        libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      }
    }
    else if ((int)in_RDI[0x7f] == 0) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
    else {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
    *(undefined1 *)((long)in_RDI + 0x3f4) = 1;
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource * /*video*/,
                          ::libaom_test::Encoder *encoder) override {
    if (!encoder_initialized_) {
      SetTileSize(encoder);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_ROW_MT, row_mt_);
      if (encoding_mode_ == ::libaom_test::kOnePassGood ||
          encoding_mode_ == ::libaom_test::kTwoPassGood) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 5);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
        encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 0);
        encoder->Control(AV1E_SET_MAX_GF_INTERVAL, 4);
        // In row_mt_=0 case, the output of single thread (1 thread) will be
        // compared with multi thread (4 thread) output (as per line no:340).
        // Currently, Loop restoration stage is conditionally disabled for speed
        // 5, 6 when num_workers > 1. Due to this, the match between single
        // thread and multi thread output can not be achieved. Hence, testing
        // this case alone with LR disabled.
        // TODO(aomedia:3446): Remove the constraint on this test case once Loop
        // restoration state is same in both single and multi thread path.
        if (set_cpu_used_ >= 5 && row_mt_ == 0)
          encoder->Control(AV1E_SET_ENABLE_RESTORATION, 0);
      } else if (encoding_mode_ == ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 0);
        encoder->Control(AV1E_SET_AQ_MODE, 3);
        encoder->Control(AV1E_SET_COEFF_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MODE_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MV_COST_UPD_FREQ, 3);
        encoder->Control(AV1E_SET_DV_COST_UPD_FREQ, 3);
      } else {
        encoder->Control(AOME_SET_CQ_LEVEL, kCqLevel);
      }
      encoder_initialized_ = true;
    }
  }